

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void EV_LightChange(int tag,int value)

{
  FSectorTagIterator local_1c;
  FSectorTagIterator it;
  int secnum;
  int value_local;
  int tag_local;
  
  it.start = value;
  FSectorTagIterator::FSectorTagIterator(&local_1c,tag);
  while( true ) {
    it.searchtag = FSectorTagIterator::Next(&local_1c);
    if (it.searchtag < 0) break;
    sector_t::SetLightLevel(sectors + it.searchtag,sectors[it.searchtag].lightlevel + it.start);
  }
  return;
}

Assistant:

void EV_LightChange (int tag, int value)
{
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sectors[secnum].SetLightLevel(sectors[secnum].lightlevel + value);
	}
}